

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

RPCHelpMan * wallet::listlabels(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_02;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff8e8;
  undefined8 in_stack_fffffffffffff8f0;
  undefined8 in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff900;
  _Manager_type in_stack_fffffffffffff908;
  undefined8 in_stack_fffffffffffff910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff918;
  pointer in_stack_fffffffffffff928;
  pointer pRVar1;
  pointer in_stack_fffffffffffff930;
  pointer pRVar2;
  pointer in_stack_fffffffffffff938;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff958 [16];
  undefined8 in_stack_fffffffffffff968;
  pointer in_stack_fffffffffffff970;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff988 [16];
  undefined1 in_stack_fffffffffffff998 [56];
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  char *local_3f0;
  size_type local_3e8;
  char local_3e0 [8];
  undefined8 uStack_3d8;
  string local_3d0 [32];
  string local_3b0 [32];
  RPCResult local_390;
  string local_308 [32];
  string local_2e8 [32];
  RPCResult local_2c8;
  RPCArgOptions local_240;
  string local_1f8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1d8;
  undefined1 local_180;
  string local_178 [32];
  RPCArg local_158;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"listlabels",(allocator<char> *)&stack0xfffffffffffff9af);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "\nReturns the list of all labels, or labels that are assigned to addresses with a specific purpose.\n"
             ,(allocator<char> *)&stack0xfffffffffffff9ae);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"purpose",(allocator<char> *)&stack0xfffffffffffff98f);
  local_1d8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_180 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,
             "Address purpose to list labels for (\'send\',\'receive\'). An empty string is the same as not providing this argument."
             ,(allocator<char> *)&stack0xfffffffffffff98e);
  local_240.oneline_description._M_dataplus._M_p = (pointer)&local_240.oneline_description.field_2;
  local_240.skip_type_check = false;
  local_240.oneline_description._M_string_length = 0;
  local_240.oneline_description.field_2._M_local_buf[0] = '\0';
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_240._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff8f0;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff8f8;
  name.field_2._8_8_ = in_stack_fffffffffffff900;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff910;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff908;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff918;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff928;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff930;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff938;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff940._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff940._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff940._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff958;
  description_02._M_string_length = (size_type)in_stack_fffffffffffff970;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff968;
  description_02.field_2 = in_stack_fffffffffffff978;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff998._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff998._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff998._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffff998[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffff998[0x31];
  opts._66_6_ = in_stack_fffffffffffff998._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffff988[0];
  opts._1_7_ = in_stack_fffffffffffff988._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff988._8_8_;
  RPCArg::RPCArg(&local_158,name,(Type)local_178,fallback,description_02,opts);
  __l._M_len = 1;
  __l._M_array = &local_158;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff990,__l,
             (allocator_type *)&stack0xfffffffffffff98d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"",(allocator<char> *)&stack0xfffffffffffff96f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"",(allocator<char> *)&stack0xfffffffffffff96e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b0,"label",(allocator<char> *)&stack0xfffffffffffff94f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d0,"Label name",(allocator<char> *)&stack0xfffffffffffff94e);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff8f0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8f8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff900;
  description._M_string_length = in_stack_fffffffffffff910;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff908;
  description.field_2 = in_stack_fffffffffffff918;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_390,STR,m_key_name,description,inner,SUB81(local_3b0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_390;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff950,__l_00,
             (allocator_type *)&stack0xfffffffffffff927);
  m_key_name_00._M_string_length = in_stack_fffffffffffff8f0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff8f8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff900;
  description_00._M_string_length = in_stack_fffffffffffff910;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff908;
  description_00.field_2 = in_stack_fffffffffffff918;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar2;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar1;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar3;
  RPCResult::RPCResult(&local_2c8,ARR,m_key_name_00,description_00,inner_00,SUB81(local_2e8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f0;
  result._0_8_ = in_stack_fffffffffffff8e8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff8f8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff900;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff908;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff910;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff918;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffff940;
  result.m_cond._8_16_ = in_stack_fffffffffffff958;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff968;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff970,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"listlabels",(allocator<char> *)&stack0xfffffffffffff926);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"",(allocator<char> *)&stack0xfffffffffffff925);
  HelpExampleCli(&local_4f0,&local_510,&local_530);
  std::operator+(&local_4d0,"\nList all labels\n",&local_4f0);
  std::operator+(&local_4b0,&local_4d0,"\nList labels that have receiving addresses\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"listlabels",(allocator<char> *)&stack0xfffffffffffff924);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"receive",(allocator<char> *)&stack0xfffffffffffff923);
  HelpExampleCli(&local_550,&local_570,&local_590);
  std::operator+(&local_490,&local_4b0,&local_550);
  std::operator+(&local_470,&local_490,"\nList labels that have sending addresses\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"listlabels",(allocator<char> *)&stack0xfffffffffffff922);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"send",(allocator<char> *)&stack0xfffffffffffff921);
  HelpExampleCli(&local_5b0,&local_5d0,&local_5f0);
  std::operator+(&local_450,&local_470,&local_5b0);
  std::operator+(&local_430,&local_450,"\nAs a JSON-RPC call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"listlabels",(allocator<char> *)&stack0xfffffffffffff920);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff9b0,"receive",
             (allocator<char> *)&stack0xfffffffffffff91f);
  HelpExampleRpc(&local_610,&local_630,(string *)&stack0xfffffffffffff9b0);
  std::operator+(&local_410,&local_430,&local_610);
  local_3f0 = local_3e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p == &local_410.field_2) {
    uStack_3d8 = local_410.field_2._8_8_;
  }
  else {
    local_3f0 = local_410._M_dataplus._M_p;
  }
  local_3e8 = local_410._M_string_length;
  local_410._M_string_length = 0;
  local_410.field_2._M_local_buf[0] = '\0';
  description_01._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:749:9)>
       ::_M_invoke;
  description_01._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:749:9)>
                ::_M_manager;
  description_01.field_2 = in_stack_fffffffffffff918;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = in_stack_fffffffffffff968;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff958._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff958._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff970;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff988._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffff988._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffff978._M_local_buf;
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff8f0,&stack0xfffffffffffff8f8)),
             description_01,args,(RPCResults)in_stack_fffffffffffff940,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff8f8);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff9b0);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff970);
  RPCResult::~RPCResult(&local_2c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff950);
  RPCResult::~RPCResult(&local_390);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff928);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff990);
  RPCArg::~RPCArg(&local_158);
  RPCArgOptions::~RPCArgOptions(&local_240);
  std::__cxx11::string::~string(local_1f8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1d8._M_first);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listlabels()
{
    return RPCHelpMan{"listlabels",
                "\nReturns the list of all labels, or labels that are assigned to addresses with a specific purpose.\n",
                {
                    {"purpose", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Address purpose to list labels for ('send','receive'). An empty string is the same as not providing this argument."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::STR, "label", "Label name"},
                    }
                },
                RPCExamples{
            "\nList all labels\n"
            + HelpExampleCli("listlabels", "") +
            "\nList labels that have receiving addresses\n"
            + HelpExampleCli("listlabels", "receive") +
            "\nList labels that have sending addresses\n"
            + HelpExampleCli("listlabels", "send") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("listlabels", "receive")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    std::optional<AddressPurpose> purpose;
    if (!request.params[0].isNull()) {
        std::string purpose_str = request.params[0].get_str();
        if (!purpose_str.empty()) {
            purpose = PurposeFromString(purpose_str);
            if (!purpose) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid 'purpose' argument, must be a known purpose string, typically 'send', or 'receive'.");
            }
        }
    }

    // Add to a set to sort by label name, then insert into Univalue array
    std::set<std::string> label_set = pwallet->ListAddrBookLabels(purpose);

    UniValue ret(UniValue::VARR);
    for (const std::string& name : label_set) {
        ret.push_back(name);
    }

    return ret;
},
    };
}